

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

void AdditionHelper<unsigned_int,_unsigned_long,_4>::
     AdditionThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (uint *lhs,unsigned_long *rhs,uint *result)

{
  ulong uVar1;
  
  uVar1 = (ulong)*lhs + *rhs;
  if ((!CARRY8((ulong)*lhs,*rhs)) && (uVar1 >> 0x20 == 0)) {
    *result = (uint)uVar1;
    return;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void AdditionThrow( const T& lhs, const U& rhs, T& result ) SAFEINT_CPP_THROW
    {
        //lhs std::uint64_t, rhs unsigned
        std::uint64_t tmp = (std::uint64_t)lhs + (std::uint64_t)rhs;

        // We added and it didn't get smaller
        if( tmp >= lhs && tmp <= std::numeric_limits<T>::max() )
        {
            result = (T)tmp;
            return;
        }

        E::SafeIntOnOverflow();
    }